

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

OpenRangeListSyntax * __thiscall slang::parsing::Parser::parseOpenRangeList(Parser *this)

{
  Token closeBrace_00;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  Token openBrace_00;
  OpenRangeListSyntax *pOVar1;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> local_98;
  Info *local_68;
  Info *local_60;
  anon_class_8_1_8991fb9c local_58;
  undefined4 local_4c;
  undefined1 local_48 [8];
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> list;
  Token closeBrace;
  Token openBrace;
  Parser *this_local;
  
  Token::Token((Token *)&closeBrace.info);
  Token::Token((Token *)&list.size_);
  nonstd::span_lite::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::span<true,_0>
            ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)local_48);
  local_4c = 0x390005;
  local_58.this = this;
  ParserBase::
  parseList<&slang::syntax::SyntaxFacts::isPossibleOpenRangeElement,&slang::syntax::SyntaxFacts::isEndOfBracedList,slang::parsing::Parser::parseOpenRangeList()::__0>
            (&this->super_ParserBase,OpenBrace,CloseBrace,Comma,(Token *)&closeBrace.info,
             (span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)local_48,
             (Token *)&list.size_,True,(DiagCode)0x390005,&local_58,False);
  local_68 = closeBrace.info;
  local_60 = (Info *)openBrace._0_8_;
  elements.size_ = (size_type)list.data_;
  elements.data_ = (pointer)local_48;
  slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::SeparatedSyntaxList
            (&local_98,elements);
  openBrace_00.info = local_60;
  openBrace_00._0_8_ = local_68;
  closeBrace_00.info = (Info *)closeBrace._0_8_;
  closeBrace_00.kind = (undefined2)list.size_;
  closeBrace_00._2_1_ = list.size_._2_1_;
  closeBrace_00.numFlags.raw = list.size_._3_1_;
  closeBrace_00.rawLen = list.size_._4_4_;
  pOVar1 = slang::syntax::SyntaxFactory::openRangeList
                     (&this->factory,openBrace_00,&local_98,closeBrace_00);
  return pOVar1;
}

Assistant:

OpenRangeListSyntax& Parser::parseOpenRangeList() {
    Token openBrace;
    Token closeBrace;
    span<TokenOrSyntax> list;

    parseList<isPossibleOpenRangeElement, isEndOfBracedList>(
        TokenKind::OpenBrace, TokenKind::CloseBrace, TokenKind::Comma, openBrace, list, closeBrace,
        RequireItems::True, diag::ExpectedOpenRangeElement,
        [this] { return &parseOpenRangeElement(); });

    return factory.openRangeList(openBrace, list, closeBrace);
}